

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O0

int mac_method_hmac_sha2_256_hash
              (LIBSSH2_SESSION *session,uchar *buf,uint32_t seqno,uchar *packet,size_t packet_len,
              uchar *addtl,size_t addtl_len,void **abstract)

{
  int iVar1;
  bool local_51;
  uint local_50;
  uchar local_4c [4];
  int res;
  uchar seqno_buf [4];
  EVP_MAC_CTX *ctx;
  uchar *addtl_local;
  size_t packet_len_local;
  uchar *packet_local;
  uint32_t seqno_local;
  uchar *buf_local;
  LIBSSH2_SESSION *session_local;
  
  _libssh2_htonu32(local_4c,seqno);
  iVar1 = _libssh2_hmac_ctx_init((EVP_MAC_CTX **)&res);
  if (iVar1 == 0) {
    session_local._4_4_ = 1;
  }
  else {
    iVar1 = _libssh2_hmac_sha256_init((EVP_MAC_CTX **)&res,*abstract,0x20);
    local_51 = false;
    if (iVar1 != 0) {
      iVar1 = _libssh2_hmac_update((EVP_MAC_CTX **)&res,local_4c,4);
      local_51 = false;
      if (iVar1 != 0) {
        iVar1 = _libssh2_hmac_update((EVP_MAC_CTX **)&res,packet,packet_len);
        local_51 = iVar1 != 0;
      }
    }
    local_50 = (uint)local_51;
    if (((local_50 != 0) && (addtl != (uchar *)0x0)) && (addtl_len != 0)) {
      local_50 = _libssh2_hmac_update((EVP_MAC_CTX **)&res,addtl,addtl_len);
    }
    if (local_50 != 0) {
      local_50 = _libssh2_hmac_final((EVP_MAC_CTX **)&res,buf);
    }
    _libssh2_hmac_cleanup((EVP_MAC_CTX **)&res);
    session_local._4_4_ = (uint)((local_50 != 0 ^ 0xffU) & 1);
  }
  return session_local._4_4_;
}

Assistant:

static int
mac_method_hmac_sha2_256_hash(LIBSSH2_SESSION * session,
                              unsigned char *buf, uint32_t seqno,
                              const unsigned char *packet,
                              size_t packet_len,
                              const unsigned char *addtl,
                              size_t addtl_len, void **abstract)
{
    libssh2_hmac_ctx ctx;
    unsigned char seqno_buf[4];
    int res;
    (void)session;

    _libssh2_htonu32(seqno_buf, seqno);

    if(!_libssh2_hmac_ctx_init(&ctx))
        return 1;
    res = _libssh2_hmac_sha256_init(&ctx, *abstract, 32) &&
          _libssh2_hmac_update(&ctx, seqno_buf, 4) &&
          _libssh2_hmac_update(&ctx, packet, packet_len);
    if(res && addtl && addtl_len)
        res = _libssh2_hmac_update(&ctx, addtl, addtl_len);
    if(res)
        res = _libssh2_hmac_final(&ctx, buf);
    _libssh2_hmac_cleanup(&ctx);

    return !res;
}